

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json<wchar_t,jsoncons::order_preserving_policy,std::allocator<char>>::
swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::order_preserving_policy,std::allocator<char>>::null_storage,jsoncons::basic_json<wchar_t,jsoncons::order_preserving_policy,std::allocator<char>>::int64_storage>
          (undefined8 param_1,int64_storage *param_2)

{
  basic_json<wchar_t,_jsoncons::order_preserving_policy,_std::allocator<char>_> *this;
  int64_storage temp;
  basic_json<wchar_t,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_ffffffffffffffc0;
  
  cast<jsoncons::basic_json<wchar_t,jsoncons::order_preserving_policy,std::allocator<char>>::int64_storage>
            (in_stack_ffffffffffffffc0);
  this = (basic_json<wchar_t,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
         cast<jsoncons::basic_json<wchar_t,jsoncons::order_preserving_policy,std::allocator<char>>::null_storage>
                   (in_stack_ffffffffffffffc0);
  construct<jsoncons::basic_json<wchar_t,jsoncons::order_preserving_policy,std::allocator<char>>::null_storage,jsoncons::basic_json<wchar_t,jsoncons::order_preserving_policy,std::allocator<char>>::null_storage&>
            (this,(null_storage *)param_2);
  construct<jsoncons::basic_json<wchar_t,jsoncons::order_preserving_policy,std::allocator<char>>::int64_storage,jsoncons::basic_json<wchar_t,jsoncons::order_preserving_policy,std::allocator<char>>::int64_storage&>
            (this,param_2);
  return;
}

Assistant:

void swap_l_r(identity<TypeL>,identity<TypeR>,basic_json& other) noexcept
        {
            TypeR temp{other.cast<TypeR>()};
            other.construct<TypeL>(cast<TypeL>());
            construct<TypeR>(temp);
        }